

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_to_montgomery(uint64_t *out1,uint64_t *arg1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong local_40;
  ulong local_38;
  
  uVar42 = *arg1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar42;
  uVar36 = SUB168(auVar1 * ZEXT816(0x807a394ede097652),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar42;
  uVar44 = SUB168(auVar2 * ZEXT816(0x186304212849c07b),8);
  uVar37 = SUB168(auVar2 * ZEXT816(0x186304212849c07b),0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar42;
  uVar45 = SUB168(auVar3 * ZEXT816(0x1017bb39c2d346c5),8);
  uVar38 = SUB168(auVar3 * ZEXT816(0x1017bb39c2d346c5),0);
  uVar56 = uVar42 * -0x123d7c322de84a5e;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar42;
  uVar46 = SUB168(auVar4 * ZEXT816(0x409973b4c427fcea),8);
  uVar39 = SUB168(auVar4 * ZEXT816(0x409973b4c427fcea),0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar56;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar56;
  uVar47 = SUB168(auVar6 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar40 = SUB168(auVar6 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar56;
  uVar48 = SUB168(auVar7 * ZEXT816(0xcf846e86789051d3),8);
  uVar41 = SUB168(auVar7 * ZEXT816(0xcf846e86789051d3),0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar56;
  uVar49 = SUB168(auVar8 * ZEXT816(0x7998f7b9022d759b),8);
  uVar56 = SUB168(auVar8 * ZEXT816(0x7998f7b9022d759b),0);
  uVar42 = uVar45 + uVar37;
  uVar50 = uVar42 + CARRY8(uVar46,uVar38);
  uVar42 = (ulong)(CARRY8(uVar45,uVar37) || CARRY8(uVar42,(ulong)CARRY8(uVar46,uVar38)));
  uVar37 = uVar44 + uVar36;
  uVar45 = uVar37 + uVar42;
  uVar43 = SUB168(auVar1 * ZEXT816(0x807a394ede097652),8) +
           (ulong)(CARRY8(uVar44,uVar36) || CARRY8(uVar37,uVar42));
  uVar57 = uVar49 + uVar41;
  uVar42 = (ulong)CARRY8(uVar49,uVar41);
  uVar37 = uVar48 + uVar40;
  uVar41 = uVar37 + uVar42;
  uVar42 = (ulong)(CARRY8(uVar48,uVar40) || CARRY8(uVar37,uVar42));
  local_40 = SUB168(auVar5 * ZEXT816(0x9b9f605f5a858107),0);
  uVar36 = uVar47 + local_40;
  uVar44 = uVar36 + uVar42;
  uVar37 = (ulong)(CARRY8(uVar46 + uVar38,uVar57) ||
                  CARRY8(uVar46 + uVar38 + uVar57,(ulong)CARRY8(uVar56,uVar39)));
  uVar40 = uVar41 + uVar50;
  uVar51 = uVar40 + uVar37;
  uVar37 = (ulong)(CARRY8(uVar41,uVar50) || CARRY8(uVar40,uVar37));
  uVar40 = uVar44 + uVar45;
  uVar52 = uVar40 + uVar37;
  uVar37 = (ulong)(CARRY8(uVar44,uVar45) || CARRY8(uVar40,uVar37));
  uVar48 = uVar43 + uVar37;
  uVar36 = (ulong)(CARRY8(uVar47,local_40) || CARRY8(uVar36,uVar42));
  local_38 = SUB168(auVar5 * ZEXT816(0x9b9f605f5a858107),8);
  uVar41 = uVar48 + local_38;
  uVar47 = uVar41 + uVar36;
  uVar42 = arg1[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar42;
  uVar44 = SUB168(auVar9 * ZEXT816(0x807a394ede097652),0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar42;
  uVar49 = SUB168(auVar10 * ZEXT816(0x186304212849c07b),8);
  uVar45 = SUB168(auVar10 * ZEXT816(0x186304212849c07b),0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar42;
  uVar50 = SUB168(auVar11 * ZEXT816(0x1017bb39c2d346c5),8);
  uVar40 = SUB168(auVar11 * ZEXT816(0x1017bb39c2d346c5),0);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar42;
  auVar12 = auVar12 * ZEXT816(0x409973b4c427fcea);
  uVar57 = uVar46 + uVar38 + (ulong)CARRY8(uVar56,uVar39) + uVar57;
  auVar33._8_8_ = uVar40;
  auVar33._0_8_ = uVar57;
  lVar53 = SUB168(auVar12 + auVar33,8);
  uVar39 = auVar12._8_8_ + uVar40;
  uVar42 = (ulong)CARRY8(auVar12._8_8_,uVar40);
  uVar40 = uVar50 + uVar45;
  uVar54 = uVar40 + uVar42;
  uVar42 = (ulong)(CARRY8(uVar50,uVar45) || CARRY8(uVar40,uVar42));
  uVar38 = uVar49 + uVar44;
  uVar56 = uVar38 + uVar42;
  uVar46 = SUB168(auVar12 + auVar33,0);
  uVar40 = (ulong)(CARRY8(uVar39,uVar51) ||
                  CARRY8(uVar39 + uVar51,(ulong)CARRY8(uVar57,auVar12._0_8_)));
  uVar39 = uVar54 + uVar52;
  uVar50 = uVar39 + uVar40;
  uVar40 = (ulong)(CARRY8(uVar54,uVar52) || CARRY8(uVar39,uVar40));
  uVar39 = uVar56 + uVar47;
  uVar45 = uVar39 + uVar40;
  uVar49 = SUB168(auVar9 * ZEXT816(0x807a394ede097652),8) +
           (ulong)(CARRY8(uVar49,uVar44) || CARRY8(uVar38,uVar42)) +
           (ulong)CARRY8(uVar43,uVar37) + (ulong)(CARRY8(uVar48,local_38) || CARRY8(uVar41,uVar36))
           + (ulong)(CARRY8(uVar56,uVar47) || CARRY8(uVar39,uVar40));
  uVar37 = uVar46 * -0x209193d38d83e893;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar37;
  uVar43 = SUB168(auVar13 * ZEXT816(0x9b9f605f5a858107),8);
  uVar41 = SUB168(auVar13 * ZEXT816(0x9b9f605f5a858107),0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar37;
  uVar39 = SUB168(auVar14 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar36 = SUB168(auVar14 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar37;
  uVar40 = SUB168(auVar15 * ZEXT816(0xcf846e86789051d3),8);
  uVar42 = SUB168(auVar15 * ZEXT816(0xcf846e86789051d3),0);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar37;
  uVar37 = SUB168(auVar16 * ZEXT816(0x7998f7b9022d759b),8);
  uVar38 = SUB168(auVar16 * ZEXT816(0x7998f7b9022d759b),0);
  uVar44 = uVar37 + uVar42;
  uVar42 = (ulong)CARRY8(uVar37,uVar42);
  uVar37 = uVar40 + uVar36;
  uVar48 = uVar37 + uVar42;
  uVar37 = (ulong)(CARRY8(uVar40,uVar36) || CARRY8(uVar37,uVar42));
  uVar40 = uVar39 + uVar41;
  uVar56 = uVar40 + uVar37;
  uVar42 = lVar53 + uVar51;
  uVar42 = (ulong)(CARRY8(uVar42,uVar44) || CARRY8(uVar42 + uVar44,(ulong)CARRY8(uVar46,uVar38)));
  uVar36 = uVar48 + uVar50;
  uVar54 = uVar36 + uVar42;
  uVar42 = (ulong)(CARRY8(uVar48,uVar50) || CARRY8(uVar36,uVar42));
  uVar36 = uVar56 + uVar45;
  uVar52 = uVar36 + uVar42;
  uVar36 = (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar36,uVar42));
  uVar50 = uVar49 + uVar36;
  uVar37 = (ulong)(CARRY8(uVar39,uVar41) || CARRY8(uVar40,uVar37));
  uVar41 = uVar50 + uVar43;
  uVar57 = uVar41 + uVar37;
  uVar42 = arg1[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar42;
  uVar56 = SUB168(auVar17 * ZEXT816(0x807a394ede097652),0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar42;
  uVar48 = SUB168(auVar18 * ZEXT816(0x186304212849c07b),8);
  uVar39 = SUB168(auVar18 * ZEXT816(0x186304212849c07b),0);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar42;
  uVar45 = SUB168(auVar19 * ZEXT816(0x1017bb39c2d346c5),8);
  uVar40 = SUB168(auVar19 * ZEXT816(0x1017bb39c2d346c5),0);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar42;
  auVar20 = auVar20 * ZEXT816(0x409973b4c427fcea);
  uVar44 = lVar53 + uVar51 + (ulong)CARRY8(uVar38,uVar46) + uVar44;
  auVar34._8_8_ = uVar40;
  auVar34._0_8_ = uVar44;
  lVar53 = SUB168(auVar20 + auVar34,8);
  uVar47 = auVar20._8_8_ + uVar40;
  uVar42 = (ulong)CARRY8(auVar20._8_8_,uVar40);
  uVar40 = uVar45 + uVar39;
  uVar51 = uVar40 + uVar42;
  uVar42 = (ulong)(CARRY8(uVar45,uVar39) || CARRY8(uVar40,uVar42));
  uVar38 = uVar48 + uVar56;
  uVar46 = uVar38 + uVar42;
  uVar45 = SUB168(auVar20 + auVar34,0);
  uVar40 = (ulong)(CARRY8(uVar47,uVar54) ||
                  CARRY8(uVar47 + uVar54,(ulong)CARRY8(uVar44,auVar20._0_8_)));
  uVar39 = uVar51 + uVar52;
  uVar55 = uVar39 + uVar40;
  uVar40 = (ulong)(CARRY8(uVar51,uVar52) || CARRY8(uVar39,uVar40));
  uVar39 = uVar46 + uVar57;
  uVar47 = uVar39 + uVar40;
  uVar49 = SUB168(auVar17 * ZEXT816(0x807a394ede097652),8) +
           (ulong)(CARRY8(uVar48,uVar56) || CARRY8(uVar38,uVar42)) +
           (ulong)CARRY8(uVar49,uVar36) + (ulong)(CARRY8(uVar50,uVar43) || CARRY8(uVar41,uVar37)) +
           (ulong)(CARRY8(uVar46,uVar57) || CARRY8(uVar39,uVar40));
  uVar37 = uVar45 * -0x209193d38d83e893;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar37;
  uVar44 = SUB168(auVar21 * ZEXT816(0x9b9f605f5a858107),8);
  uVar41 = SUB168(auVar21 * ZEXT816(0x9b9f605f5a858107),0);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar37;
  uVar39 = SUB168(auVar22 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar36 = SUB168(auVar22 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar37;
  uVar40 = SUB168(auVar23 * ZEXT816(0xcf846e86789051d3),8);
  uVar42 = SUB168(auVar23 * ZEXT816(0xcf846e86789051d3),0);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar37;
  uVar37 = SUB168(auVar24 * ZEXT816(0x7998f7b9022d759b),8);
  uVar38 = SUB168(auVar24 * ZEXT816(0x7998f7b9022d759b),0);
  uVar58 = uVar37 + uVar42;
  uVar42 = (ulong)CARRY8(uVar37,uVar42);
  uVar37 = uVar40 + uVar36;
  uVar43 = uVar37 + uVar42;
  uVar37 = (ulong)(CARRY8(uVar40,uVar36) || CARRY8(uVar37,uVar42));
  uVar40 = uVar39 + uVar41;
  uVar56 = uVar40 + uVar37;
  uVar42 = lVar53 + uVar54;
  uVar42 = (ulong)(CARRY8(uVar42,uVar58) || CARRY8(uVar42 + uVar58,(ulong)CARRY8(uVar45,uVar38)));
  uVar36 = uVar43 + uVar55;
  uVar51 = uVar36 + uVar42;
  uVar42 = (ulong)(CARRY8(uVar43,uVar55) || CARRY8(uVar36,uVar42));
  uVar36 = uVar56 + uVar47;
  uVar46 = uVar36 + uVar42;
  uVar36 = (ulong)(CARRY8(uVar56,uVar47) || CARRY8(uVar36,uVar42));
  uVar50 = uVar49 + uVar36;
  uVar37 = (ulong)(CARRY8(uVar39,uVar41) || CARRY8(uVar40,uVar37));
  uVar41 = uVar50 + uVar44;
  uVar57 = uVar41 + uVar37;
  uVar42 = arg1[3];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar42;
  uVar56 = SUB168(auVar25 * ZEXT816(0x807a394ede097652),0);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar42;
  uVar43 = SUB168(auVar26 * ZEXT816(0x186304212849c07b),8);
  uVar39 = SUB168(auVar26 * ZEXT816(0x186304212849c07b),0);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar42;
  uVar48 = SUB168(auVar27 * ZEXT816(0x1017bb39c2d346c5),8);
  uVar40 = SUB168(auVar27 * ZEXT816(0x1017bb39c2d346c5),0);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar42;
  auVar28 = auVar28 * ZEXT816(0x409973b4c427fcea);
  uVar58 = uVar58 + lVar53 + uVar54 + (ulong)CARRY8(uVar38,uVar45);
  auVar35._8_8_ = uVar40;
  auVar35._0_8_ = uVar58;
  lVar53 = SUB168(auVar28 + auVar35,8);
  uVar45 = auVar28._8_8_ + uVar40;
  uVar42 = (ulong)CARRY8(auVar28._8_8_,uVar40);
  uVar40 = uVar48 + uVar39;
  uVar47 = uVar40 + uVar42;
  uVar42 = (ulong)(CARRY8(uVar48,uVar39) || CARRY8(uVar40,uVar42));
  uVar38 = uVar43 + uVar56;
  uVar52 = uVar38 + uVar42;
  uVar55 = SUB168(auVar28 + auVar35,0);
  uVar40 = (ulong)(CARRY8(uVar45,uVar51) ||
                  CARRY8(uVar45 + uVar51,(ulong)CARRY8(uVar58,auVar28._0_8_)));
  uVar39 = uVar47 + uVar46;
  uVar48 = uVar39 + uVar40;
  uVar40 = (ulong)(CARRY8(uVar47,uVar46) || CARRY8(uVar39,uVar40));
  uVar39 = uVar52 + uVar57;
  uVar54 = uVar39 + uVar40;
  uVar43 = SUB168(auVar25 * ZEXT816(0x807a394ede097652),8) +
           (ulong)(CARRY8(uVar43,uVar56) || CARRY8(uVar38,uVar42)) +
           (ulong)CARRY8(uVar49,uVar36) + (ulong)(CARRY8(uVar50,uVar44) || CARRY8(uVar41,uVar37)) +
           (ulong)(CARRY8(uVar52,uVar57) || CARRY8(uVar39,uVar40));
  uVar42 = uVar55 * -0x209193d38d83e893;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar42;
  uVar39 = SUB168(auVar29 * ZEXT816(0x9b9f605f5a858107),8);
  uVar41 = SUB168(auVar29 * ZEXT816(0x9b9f605f5a858107),0);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar42;
  uVar56 = SUB168(auVar30 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar40 = SUB168(auVar30 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar42;
  uVar44 = SUB168(auVar31 * ZEXT816(0xcf846e86789051d3),8);
  uVar37 = SUB168(auVar31 * ZEXT816(0xcf846e86789051d3),0);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar42;
  uVar36 = SUB168(auVar32 * ZEXT816(0x7998f7b9022d759b),8);
  uVar38 = SUB168(auVar32 * ZEXT816(0x7998f7b9022d759b),0);
  uVar42 = lVar53 + uVar51;
  uVar45 = uVar36 + uVar37;
  uVar37 = (ulong)CARRY8(uVar36,uVar37);
  uVar36 = uVar44 + uVar40;
  uVar47 = uVar36 + uVar37;
  uVar37 = (ulong)(CARRY8(uVar44,uVar40) || CARRY8(uVar36,uVar37));
  uVar36 = uVar56 + uVar41;
  uVar44 = uVar36 + uVar37;
  uVar42 = (ulong)(CARRY8(uVar42,uVar45) || CARRY8(uVar42 + uVar45,(ulong)CARRY8(uVar55,uVar38)));
  uVar40 = uVar47 + uVar48;
  uVar46 = uVar40 + uVar42;
  uVar42 = (ulong)(CARRY8(uVar47,uVar48) || CARRY8(uVar40,uVar42));
  uVar40 = uVar44 + uVar54;
  uVar48 = uVar40 + uVar42;
  uVar42 = (ulong)(CARRY8(uVar44,uVar54) || CARRY8(uVar40,uVar42));
  uVar40 = uVar43 + uVar42;
  uVar45 = uVar45 + lVar53 + uVar51 + (ulong)CARRY8(uVar38,uVar55);
  uVar37 = (ulong)(CARRY8(uVar56,uVar41) || CARRY8(uVar36,uVar37));
  uVar36 = uVar40 + uVar39;
  uVar41 = uVar36 + uVar37;
  uVar38 = (ulong)(byte)-((0x7998f7b9022d759a < uVar45) + -1);
  uVar56 = uVar46 - uVar38;
  uVar38 = (ulong)(byte)-((-1 - (uVar46 < uVar38)) + (0xcf846e86789051d2 < uVar56));
  uVar44 = uVar48 - uVar38;
  uVar38 = (ulong)(byte)-((-1 - (uVar48 < uVar38)) + (0xab1ec85e6b41c8a9 < uVar44));
  uVar47 = uVar41 - uVar38;
  uVar42 = -(ulong)((byte)(CARRY8(uVar43,uVar42) + (CARRY8(uVar40,uVar39) || CARRY8(uVar36,uVar37)))
                   < (byte)-((-1 - (uVar41 < uVar38)) + (0x9b9f605f5a858106 < uVar47)));
  uVar37 = ~uVar42;
  *out1 = uVar45 + 0x86670846fdd28a65 & uVar37 | uVar45 & uVar42;
  out1[1] = uVar56 + 0x307b9179876fae2d & uVar37 | uVar46 & uVar42;
  out1[2] = uVar44 + 0x54e137a194be3756 & uVar37 | uVar48 & uVar42;
  out1[3] = uVar37 & uVar47 + 0x64609fa0a57a7ef9 | uVar42 & uVar41;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_to_montgomery(
    uint64_t out1[4], const uint64_t arg1[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x30;
    uint64_t x31;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x32;
    uint64_t x33;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x34;
    uint64_t x35;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x36;
    uint64_t x37;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x38;
    uint64_t x39;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x40;
    uint64_t x41;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x42;
    uint64_t x43;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x54;
    uint64_t x55;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x56;
    uint64_t x57;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x58;
    uint64_t x59;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x60;
    uint64_t x61;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x62;
    uint64_t x63;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x64;
    uint64_t x65;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x66;
    uint64_t x67;
    uint64_t x68;
    uint64_t x69;
    uint64_t x70;
    uint64_t x71;
    uint64_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x78;
    uint64_t x79;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x80;
    uint64_t x81;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x82;
    uint64_t x83;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x84;
    uint64_t x85;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x86;
    uint64_t x87;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x88;
    uint64_t x89;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x90;
    uint64_t x91;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x92;
    uint64_t x93;
    uint64_t x94;
    uint64_t x95;
    uint64_t x96;
    uint64_t x97;
    uint64_t x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x102;
    uint64_t x103;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x104;
    uint64_t x105;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x106;
    uint64_t x107;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x108;
    uint64_t x109;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x110;
    uint64_t x111;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x112;
    uint64_t x113;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x114;
    uint64_t x115;
    uint64_t x116;
    uint64_t x117;
    uint64_t x118;
    uint64_t x119;
    uint64_t x120;
    uint64_t x121;
    uint64_t x122;
    uint64_t x123;
    uint64_t x124;
    uint64_t x125;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x126;
    uint64_t x127;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x128;
    uint64_t x129;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x130;
    uint64_t x131;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x132;
    uint64_t x133;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x134;
    uint64_t x135;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x136;
    uint64_t x137;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x138;
    uint64_t x139;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x140;
    uint64_t x141;
    uint64_t x142;
    uint64_t x143;
    uint64_t x144;
    uint64_t x145;
    uint64_t x146;
    uint64_t x147;
    uint64_t x148;
    uint64_t x149;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x150;
    uint64_t x151;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x152;
    uint64_t x153;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x154;
    uint64_t x155;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x156;
    uint64_t x157;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x158;
    uint64_t x159;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x160;
    uint64_t x161;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x162;
    uint64_t x163;
    uint64_t x164;
    uint64_t x165;
    uint64_t x166;
    uint64_t x167;
    uint64_t x168;
    uint64_t x169;
    uint64_t x170;
    uint64_t x171;
    uint64_t x172;
    uint64_t x173;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x174;
    uint64_t x175;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x176;
    uint64_t x177;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x178;
    uint64_t x179;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x180;
    uint64_t x181;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x182;
    uint64_t x183;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x184;
    uint64_t x185;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x186;
    uint64_t x187;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x188;
    uint64_t x189;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x190;
    uint64_t x191;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x192;
    uint64_t x193;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x194;
    uint64_t x195;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x196;
    uint64_t x197;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x198;
    uint64_t x199;
    uint64_t x200;
    uint64_t x201;
    uint64_t x202;
    x1 = (arg1[1]);
    x2 = (arg1[2]);
    x3 = (arg1[3]);
    x4 = (arg1[0]);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x5, &x6, x4, UINT64_C(0x807a394ede097652));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x7, &x8, x4, UINT64_C(0x186304212849c07b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x9, &x10, x4, UINT64_C(0x1017bb39c2d346c5));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x11, &x12, x4, UINT64_C(0x409973b4c427fcea));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x13, &x14, 0x0,
                                                              x12, x9);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x15, &x16, x14,
                                                              x10, x7);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x17, &x18, x16,
                                                              x8, x5);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x19, &x20, x11, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x21, &x22, x19, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x23, &x24, x19, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x25, &x26, x19, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x27, &x28, x19, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x29, &x30, 0x0,
                                                              x28, x25);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x31, &x32, x30,
                                                              x26, x23);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x33, &x34, x32,
                                                              x24, x21);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x35, &x36, 0x0,
                                                              x11, x27);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x37, &x38, x36,
                                                              x13, x29);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x39, &x40, x38,
                                                              x15, x31);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x41, &x42, x40,
                                                              x17, x33);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x43, &x44, x42, (x18 + x6), (x34 + x22));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x45, &x46, x1, UINT64_C(0x807a394ede097652));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x47, &x48, x1, UINT64_C(0x186304212849c07b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x49, &x50, x1, UINT64_C(0x1017bb39c2d346c5));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x51, &x52, x1, UINT64_C(0x409973b4c427fcea));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x53, &x54, 0x0,
                                                              x52, x49);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x55, &x56, x54,
                                                              x50, x47);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x57, &x58, x56,
                                                              x48, x45);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x59, &x60, 0x0,
                                                              x37, x51);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x61, &x62, x60,
                                                              x39, x53);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x63, &x64, x62,
                                                              x41, x55);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x65, &x66, x64,
                                                              x43, x57);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x67, &x68, x59, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x69, &x70, x67, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x71, &x72, x67, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x73, &x74, x67, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x75, &x76, x67, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x77, &x78, 0x0,
                                                              x76, x73);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x79, &x80, x78,
                                                              x74, x71);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x81, &x82, x80,
                                                              x72, x69);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x83, &x84, 0x0,
                                                              x59, x75);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x85, &x86, x84,
                                                              x61, x77);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x87, &x88, x86,
                                                              x63, x79);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x89, &x90, x88,
                                                              x65, x81);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x91, &x92, x90, (((uint64_t)x66 + x44) + (x58 + x46)), (x82 + x70));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x93, &x94, x2, UINT64_C(0x807a394ede097652));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x95, &x96, x2, UINT64_C(0x186304212849c07b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x97, &x98, x2, UINT64_C(0x1017bb39c2d346c5));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x99, &x100, x2, UINT64_C(0x409973b4c427fcea));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x101, &x102, 0x0,
                                                              x100, x97);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x103, &x104,
                                                              x102, x98, x95);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x105, &x106,
                                                              x104, x96, x93);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x107, &x108, 0x0,
                                                              x85, x99);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x109, &x110,
                                                              x108, x87, x101);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x111, &x112,
                                                              x110, x89, x103);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x113, &x114,
                                                              x112, x91, x105);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x115, &x116, x107, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x117, &x118, x115, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x119, &x120, x115, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x121, &x122, x115, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x123, &x124, x115, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x125, &x126, 0x0,
                                                              x124, x121);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x127, &x128,
                                                              x126, x122, x119);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x129, &x130,
                                                              x128, x120, x117);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x131, &x132, 0x0,
                                                              x107, x123);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x133, &x134,
                                                              x132, x109, x125);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x135, &x136,
                                                              x134, x111, x127);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x137, &x138,
                                                              x136, x113, x129);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x139, &x140, x138, (((uint64_t)x114 + x92) + (x106 + x94)),
        (x130 + x118));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x141, &x142, x3, UINT64_C(0x807a394ede097652));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x143, &x144, x3, UINT64_C(0x186304212849c07b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x145, &x146, x3, UINT64_C(0x1017bb39c2d346c5));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x147, &x148, x3, UINT64_C(0x409973b4c427fcea));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x149, &x150, 0x0,
                                                              x148, x145);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x151, &x152,
                                                              x150, x146, x143);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x153, &x154,
                                                              x152, x144, x141);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x155, &x156, 0x0,
                                                              x133, x147);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x157, &x158,
                                                              x156, x135, x149);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x159, &x160,
                                                              x158, x137, x151);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x161, &x162,
                                                              x160, x139, x153);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x163, &x164, x155, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x165, &x166, x163, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x167, &x168, x163, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x169, &x170, x163, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x171, &x172, x163, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x173, &x174, 0x0,
                                                              x172, x169);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x175, &x176,
                                                              x174, x170, x167);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x177, &x178,
                                                              x176, x168, x165);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x179, &x180, 0x0,
                                                              x155, x171);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x181, &x182,
                                                              x180, x157, x173);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x183, &x184,
                                                              x182, x159, x175);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x185, &x186,
                                                              x184, x161, x177);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x187, &x188, x186, (((uint64_t)x162 + x140) + (x154 + x142)),
        (x178 + x166));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x189, &x190, 0x0, x181, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x191, &x192, x190, x183, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x193, &x194, x192, x185, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x195, &x196, x194, x187, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x197, &x198,
                                                               x196, x188, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x199, x198, x189,
                                                            x181);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x200, x198, x191,
                                                            x183);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x201, x198, x193,
                                                            x185);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x202, x198, x195,
                                                            x187);
    out1[0] = x199;
    out1[1] = x200;
    out1[2] = x201;
    out1[3] = x202;
}